

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O3

void __thiscall
ft::multiset<int,_ft::less<int>,_ft::allocator<int>_>::multiset
          (multiset<int,_ft::less<int>,_ft::allocator<int>_> *this,
          multiset<int,_ft::less<int>,_ft::allocator<int>_> *other)

{
  treeNode<int> *ptVar1;
  treeNode<int> *ptVar2;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_48;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_30;
  
  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>._vptr_treeBase =
       (_func_int **)&PTR__treeBase_0010dc90;
  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.NIL =
       (treeNode<int> *)0x0;
  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_root =
       (treeNode<int> *)0x0;
  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_first =
       (treeNode<int> *)0x0;
  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_last =
       (treeNode<int> *)0x0;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_>::treeInit
            (&(this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
              super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree);
  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size = 0;
  ptVar1 = (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
           super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_first;
  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_root =
       (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
       super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.NIL;
  ptVar2 = (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
           super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_last;
  ptVar1->parent = ptVar2;
  ptVar2->parent = ptVar1;
  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>._vptr_treeBase =
       (_func_int **)&PTR__multiset_0010dc28;
  local_48.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_tree =
       &(other->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
        super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree;
  local_48.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_node =
       ((other->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
        super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_first)->parent;
  local_48.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>._vptr_treeIterator =
       (_func_int **)&PTR__treeIterator_0010dcb8;
  local_30.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_node =
       (other->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
       super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_last;
  local_30.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>._vptr_treeIterator =
       (_func_int **)&PTR__treeIterator_0010dcb8;
  local_30.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_tree =
       local_48.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_tree;
  multiset<int,ft::less<int>,ft::allocator<int>>::
  insert<ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>>
            ((multiset<int,ft::less<int>,ft::allocator<int>> *)this,&local_48,&local_30,(type *)0x0)
  ;
  return;
}

Assistant:

multiset(multiset const & other):
		base(other) {
		this->insert(other.begin(), other.end());
	}